

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32_chorba_c.c
# Opt level: O1

uint32_t crc32_chorba_32768_nondestructive(uint32_t crc,uint64_t *buf,size_t len)

{
  ulong *puVar1;
  undefined1 auVar2 [12];
  ulong uVar3;
  size_t sVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  size_t sVar8;
  ulong uVar9;
  ulong uVar10;
  uint32_t uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined4 uVar14;
  undefined4 uVar17;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  ulong uVar18;
  ulong uVar22;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  uint64_t bitbuffer [4096];
  uint local_8098;
  uint uStack_8094;
  uint uStack_8090;
  uint uStack_808c;
  undefined1 local_8088 [16];
  undefined1 local_8078 [16];
  undefined1 local_8068 [16];
  undefined1 local_8058 [16];
  undefined8 local_8048;
  ulong local_8038 [2];
  ulong auStack_8028 [143];
  ulong auStack_7bb0 [38];
  ulong auStack_7a80 [28];
  ulong auStack_79a0 [89];
  ulong auStack_76d8 [3797];
  ulong uVar23;
  
  sVar8 = 0;
  memset(local_8038,0,0x8000);
  local_8038[0] = (ulong)crc;
  if (0x9a0 < len) {
    sVar4 = 0;
    do {
      uVar3 = *(ulong *)((long)buf + sVar4) ^ *(ulong *)((long)local_8038 + sVar4);
      uVar9 = ((ulong *)((long)buf + sVar4))[1] ^ *(ulong *)((long)local_8038 + sVar4 + 8);
      *(ulong *)((long)auStack_7bb0 + sVar4) = *(ulong *)((long)auStack_7bb0 + sVar4) ^ uVar3;
      *(ulong *)((long)auStack_7bb0 + sVar4 + 8) =
           *(ulong *)((long)auStack_7bb0 + sVar4 + 8) ^ uVar9;
      puVar1 = (ulong *)((long)buf + sVar4 + 0x10);
      uVar10 = *puVar1 ^ *(ulong *)((long)auStack_8028 + sVar4);
      uVar5 = puVar1[1] ^ *(ulong *)((long)auStack_8028 + sVar4 + 8);
      *(ulong *)((long)auStack_7bb0 + sVar4 + 0x10) =
           *(ulong *)((long)auStack_7bb0 + sVar4 + 0x10) ^ uVar10;
      *(ulong *)((long)auStack_7bb0 + sVar4 + 0x18) =
           *(ulong *)((long)auStack_7bb0 + sVar4 + 0x18) ^ uVar5;
      puVar1 = (ulong *)((long)buf + sVar4 + 0x20);
      uVar7 = *puVar1 ^ *(ulong *)((long)auStack_8028 + sVar4 + 0x10);
      uVar23 = puVar1[1] ^ *(ulong *)((long)auStack_8028 + sVar4 + 0x18);
      *(ulong *)((long)auStack_7bb0 + sVar4 + 0x20) =
           *(ulong *)((long)auStack_7bb0 + sVar4 + 0x20) ^ uVar7;
      *(ulong *)((long)auStack_7bb0 + sVar4 + 0x28) =
           *(ulong *)((long)auStack_7bb0 + sVar4 + 0x28) ^ uVar23;
      puVar1 = (ulong *)((long)buf + sVar4 + 0x30);
      uVar18 = *puVar1 ^ *(ulong *)((long)auStack_8028 + sVar4 + 0x20);
      uVar22 = puVar1[1] ^ *(ulong *)((long)auStack_8028 + sVar4 + 0x28);
      *(ulong *)((long)auStack_7bb0 + sVar4 + 0x30) =
           *(ulong *)((long)auStack_7bb0 + sVar4 + 0x30) ^ uVar18;
      *(ulong *)((long)auStack_7bb0 + sVar4 + 0x38) =
           *(ulong *)((long)auStack_7bb0 + sVar4 + 0x38) ^ uVar22;
      *(ulong *)((long)auStack_7a80 + sVar4) = *(ulong *)((long)auStack_7a80 + sVar4) ^ uVar3;
      *(ulong *)((long)auStack_7a80 + sVar4 + 8) =
           *(ulong *)((long)auStack_7a80 + sVar4 + 8) ^ uVar9;
      *(ulong *)((long)auStack_7a80 + sVar4 + 0x10) =
           *(ulong *)((long)auStack_7a80 + sVar4 + 0x10) ^ uVar10;
      *(ulong *)((long)auStack_7a80 + sVar4 + 0x18) =
           *(ulong *)((long)auStack_7a80 + sVar4 + 0x18) ^ uVar5;
      *(ulong *)((long)auStack_7a80 + sVar4 + 0x20) =
           *(ulong *)((long)auStack_7a80 + sVar4 + 0x20) ^ uVar7;
      *(ulong *)((long)auStack_7a80 + sVar4 + 0x28) =
           *(ulong *)((long)auStack_7a80 + sVar4 + 0x28) ^ uVar23;
      *(ulong *)((long)auStack_7a80 + sVar4 + 0x30) =
           *(ulong *)((long)auStack_7a80 + sVar4 + 0x30) ^ uVar18;
      *(ulong *)((long)auStack_7a80 + sVar4 + 0x38) =
           *(ulong *)((long)auStack_7a80 + sVar4 + 0x38) ^ uVar22;
      *(ulong *)((long)auStack_79a0 + sVar4) = *(ulong *)((long)auStack_79a0 + sVar4) ^ uVar3;
      *(ulong *)((long)auStack_79a0 + sVar4 + 8) =
           *(ulong *)((long)auStack_79a0 + sVar4 + 8) ^ uVar9;
      *(ulong *)((long)auStack_79a0 + sVar4 + 0x10) =
           *(ulong *)((long)auStack_79a0 + sVar4 + 0x10) ^ uVar10;
      *(ulong *)((long)auStack_79a0 + sVar4 + 0x18) =
           *(ulong *)((long)auStack_79a0 + sVar4 + 0x18) ^ uVar5;
      *(ulong *)((long)auStack_79a0 + sVar4 + 0x20) =
           *(ulong *)((long)auStack_79a0 + sVar4 + 0x20) ^ uVar7;
      *(ulong *)((long)auStack_79a0 + sVar4 + 0x28) =
           *(ulong *)((long)auStack_79a0 + sVar4 + 0x28) ^ uVar23;
      *(ulong *)((long)auStack_79a0 + sVar4 + 0x30) =
           *(ulong *)((long)auStack_79a0 + sVar4 + 0x30) ^ uVar18;
      *(ulong *)((long)auStack_79a0 + sVar4 + 0x38) =
           *(ulong *)((long)auStack_79a0 + sVar4 + 0x38) ^ uVar22;
      *(ulong *)((long)auStack_76d8 + sVar4) = uVar3;
      *(ulong *)((long)auStack_76d8 + sVar4 + 8) = uVar9;
      *(ulong *)((long)auStack_76d8 + sVar4 + 0x10) = uVar10;
      *(ulong *)((long)auStack_76d8 + sVar4 + 0x18) = uVar5;
      *(ulong *)((long)auStack_76d8 + sVar4 + 0x20) = uVar7;
      *(ulong *)((long)auStack_76d8 + sVar4 + 0x28) = uVar23;
      *(ulong *)((long)auStack_76d8 + sVar4 + 0x30) = uVar18;
      *(ulong *)((long)auStack_76d8 + sVar4 + 0x38) = uVar22;
      sVar8 = sVar4 + 0x40;
      uVar3 = sVar4 + 0x9e0;
      sVar4 = sVar8;
    } while (uVar3 < len);
  }
  auVar29 = (undefined1  [16])0x0;
  local_8058 = (undefined1  [16])0x0;
  local_8068 = (undefined1  [16])0x0;
  local_8078 = (undefined1  [16])0x0;
  local_8088 = (undefined1  [16])0x0;
  local_8048 = 0;
  uVar11 = 0;
  if (sVar8 + 0x48 < len) {
    uVar3 = 0;
    uVar9 = 0;
    sVar4 = sVar8;
    uVar5 = 0;
    do {
      auVar29 = *(undefined1 (*) [16])((long)local_8038 + sVar4) ^
                *(undefined1 (*) [16])((long)buf + sVar4) ^ auVar29;
      uVar7 = auVar29._0_8_;
      uVar23 = auVar29._8_8_;
      auVar19._0_8_ = uVar7 << 0x11;
      auVar19._8_8_ = uVar23 << 0x11;
      auVar24._0_8_ = uVar7 << 0x37;
      auVar24._8_8_ = uVar23 << 0x37;
      auVar25 = auVar24 ^ *(undefined1 (*) [16])((long)buf + sVar4 + 0x10) ^ auVar19 ^
                *(undefined1 (*) [16])((long)auStack_8028 + sVar4);
      auVar15._0_8_ = uVar7 >> 0x2d;
      auVar15._8_8_ = uVar23 >> 0x2d;
      auVar13._0_8_ = uVar7 << 0x2c;
      auVar13._8_8_ = uVar23 << 0x2c;
      auVar16._8_8_ = uVar7 << 0x13 ^ uVar7 >> 0x2f ^ uVar7 >> 9 ^ uVar9;
      auVar16._0_8_ = uVar3;
      auVar16 = auVar16 ^ auVar25;
      uVar14 = auVar16._0_4_;
      uVar17 = auVar16._4_4_;
      auVar12._8_4_ = uVar14;
      auVar12._0_8_ = uVar23;
      auVar12._12_4_ = uVar17;
      auVar2._4_8_ = auVar25._8_8_;
      auVar2._0_4_ = auVar29._12_4_;
      auVar26._0_8_ = auVar2._0_8_ << 0x20;
      auVar26._8_4_ = uVar14;
      auVar26._12_4_ = uVar17;
      auVar27._0_8_ = auVar26._0_8_ >> 0x2f;
      auVar27._8_8_ = auVar26._8_8_ >> 0x2f;
      auVar20._8_4_ = uVar14;
      auVar20._0_8_ = uVar23;
      auVar20._12_4_ = uVar17;
      auVar21._0_8_ = uVar23 >> 9;
      auVar21._8_8_ = auVar20._8_8_ >> 9;
      auVar29._0_8_ = uVar23 << 0x13;
      auVar29._8_8_ = auVar12._8_8_ << 0x13;
      uVar9 = auVar16._0_8_;
      uVar10 = auVar16._8_8_;
      auVar28._0_8_ = uVar9 << 0x11;
      auVar28._8_8_ = uVar10 << 0x11;
      auVar25._0_8_ = uVar9 << 0x37;
      auVar25._8_8_ = uVar10 << 0x37;
      uVar3 = uVar10 << 0x13 ^
              uVar10 >> 9 ^ (ulong)(auVar16._12_4_ >> 0xf) ^
              (uVar9 << 0x2c | uVar9 >> 0x2d) ^ uVar23 >> 0x14;
      uVar9 = (uVar10 << 0x2c | (ulong)(auVar16._12_4_ >> 0xd)) ^ uVar9 >> 0x14;
      uVar10 = uVar10 >> 0x14;
      auVar30._8_8_ = uVar7 >> 0x14;
      auVar30._0_8_ = uVar5;
      auVar29 = auVar30 ^ (auVar13 | auVar15) ^ auVar21 ^ auVar29 ^ auVar27 ^ auVar25 ^ auVar28;
      sVar8 = sVar4 + 0x20;
      uVar7 = sVar4 + 0x68;
      sVar4 = sVar8;
      uVar5 = uVar10;
    } while (uVar7 < len);
  }
  else {
    uVar10 = 0;
    uVar9 = 0;
    uVar3 = 0;
  }
  memcpy(local_8088,(void *)((long)buf + sVar8),len - sVar8);
  local_8078._8_8_ = local_8078._8_8_ ^ uVar9;
  local_8078._0_8_ = local_8078._0_8_ ^ uVar3;
  local_8068._0_8_ = local_8068._0_8_ ^ uVar10;
  local_8098 = auVar29._0_4_;
  uStack_8094 = auVar29._4_4_;
  uStack_8090 = auVar29._8_4_;
  uStack_808c = auVar29._12_4_;
  local_8088._4_4_ = uStack_8094 ^ local_8088._4_4_;
  local_8088._0_4_ = local_8098 ^ local_8088._0_4_;
  local_8088._8_4_ = uStack_8090 ^ local_8088._8_4_;
  local_8088._12_4_ = uStack_808c ^ local_8088._12_4_;
  if (len != sVar8) {
    lVar6 = 0;
    uVar11 = 0;
    do {
      uVar11 = uVar11 >> 8 ^
               crc_table[(byte)(local_8088[lVar6] ^ (byte)uVar11 ^
                               *(byte *)((long)local_8038 + lVar6 + sVar8))];
      lVar6 = lVar6 + 1;
    } while (len - sVar8 != lVar6);
  }
  return uVar11;
}

Assistant:

Z_INTERNAL uint32_t crc32_chorba_32768_nondestructive (uint32_t crc, const uint64_t* buf, size_t len) {
    const uint64_t* input = buf;
    uint64_t bitbuffer[32768 / sizeof(uint64_t)];
    const uint8_t* bitbufferbytes = (const uint8_t*) bitbuffer;
    memset(bitbuffer, 0, 32768);
    bitbuffer[0] ^= crc;
    crc = 0;

    size_t i = 0;

    for(; i + 300*8+64 < len; i += 64) {
        uint64_t in1, in2, in3, in4;
        uint64_t in5, in6, in7, in8;
        size_t inoffset = (i/8);

        in1 = input[i / sizeof(uint64_t) + 0] ^ bitbuffer[inoffset + 0];
        in2 = input[i / sizeof(uint64_t) + 1] ^ bitbuffer[inoffset + 1];
        in3 = input[i / sizeof(uint64_t) + 2] ^ bitbuffer[inoffset + 2];
        in4 = input[i / sizeof(uint64_t) + 3] ^ bitbuffer[inoffset + 3];
        in5 = input[i / sizeof(uint64_t) + 4] ^ bitbuffer[inoffset + 4];
        in6 = input[i / sizeof(uint64_t) + 5] ^ bitbuffer[inoffset + 5];
        in7 = input[i / sizeof(uint64_t) + 6] ^ bitbuffer[inoffset + 6];
        in8 = input[i / sizeof(uint64_t) + 7] ^ bitbuffer[inoffset + 7];

        // [0, 145, 183, 211]

        bitbuffer[(i/8 + 0 + 145)] ^= in1;
        bitbuffer[(i/8 + 1 + 145)] ^= in2;
        bitbuffer[(i/8 + 2 + 145)] ^= in3;
        bitbuffer[(i/8 + 3 + 145)] ^= in4;
        bitbuffer[(i/8 + 4 + 145)] ^= in5;
        bitbuffer[(i/8 + 5 + 145)] ^= in6;
        bitbuffer[(i/8 + 6 + 145)] ^= in7;
        bitbuffer[(i/8 + 7 + 145)] ^= in8;

        bitbuffer[(i/8 + 0 + 183)] ^= in1;
        bitbuffer[(i/8 + 1 + 183)] ^= in2;
        bitbuffer[(i/8 + 2 + 183)] ^= in3;
        bitbuffer[(i/8 + 3 + 183)] ^= in4;
        bitbuffer[(i/8 + 4 + 183)] ^= in5;
        bitbuffer[(i/8 + 5 + 183)] ^= in6;
        bitbuffer[(i/8 + 6 + 183)] ^= in7;
        bitbuffer[(i/8 + 7 + 183)] ^= in8;

        bitbuffer[(i/8 + 0 + 211)] ^= in1;
        bitbuffer[(i/8 + 1 + 211)] ^= in2;
        bitbuffer[(i/8 + 2 + 211)] ^= in3;
        bitbuffer[(i/8 + 3 + 211)] ^= in4;
        bitbuffer[(i/8 + 4 + 211)] ^= in5;
        bitbuffer[(i/8 + 5 + 211)] ^= in6;
        bitbuffer[(i/8 + 6 + 211)] ^= in7;
        bitbuffer[(i/8 + 7 + 211)] ^= in8;

        bitbuffer[(i/8 + 0 + 300)] = in1;
        bitbuffer[(i/8 + 1 + 300)] = in2;
        bitbuffer[(i/8 + 2 + 300)] = in3;
        bitbuffer[(i/8 + 3 + 300)] = in4;
        bitbuffer[(i/8 + 4 + 300)] = in5;
        bitbuffer[(i/8 + 5 + 300)] = in6;
        bitbuffer[(i/8 + 6 + 300)] = in7;
        bitbuffer[(i/8 + 7 + 300)] = in8;
    }

    uint64_t next1_64 = 0;
    uint64_t next2_64 = 0;
    uint64_t next3_64 = 0;
    uint64_t next4_64 = 0;
    uint64_t next5_64 = 0;
    uint64_t final[9] = {0};

    for(; (i + 72 < len); i += 32) {
        uint64_t in1;
        uint64_t in2;
        uint64_t in3;
        uint64_t in4;
        uint64_t a1, a2, a3, a4;
        uint64_t b1, b2, b3, b4;
        uint64_t c1, c2, c3, c4;
        uint64_t d1, d2, d3, d4;

        uint64_t out1;
        uint64_t out2;
        uint64_t out3;
        uint64_t out4;
        uint64_t out5;

        in1 = input[i / sizeof(z_word_t)] ^ bitbuffer[(i / sizeof(uint64_t))];
        in2 = input[(i + 8) / sizeof(z_word_t)] ^ bitbuffer[(i / sizeof(uint64_t) + 1)];
#if BYTE_ORDER == BIG_ENDIAN
        in1 = ZSWAP64(in1);
        in2 = ZSWAP64(in2);
#endif
        in1 ^= next1_64;
        in2 ^= next2_64;

        a1 = (in1 << 17) ^ (in1 << 55);
        a2 = (in1 >> 47) ^ (in1 >> 9) ^ (in1 << 19);
        a3 = (in1 >> 45) ^ (in1 << 44);
        a4 = (in1 >> 20);

        b1 = (in2 << 17) ^ (in2 << 55);
        b2 = (in2 >> 47) ^ (in2 >> 9) ^ (in2 << 19);
        b3 = (in2 >> 45) ^ (in2 << 44);
        b4 = (in2 >> 20);

        in3 = input[(i + 16) / sizeof(z_word_t)] ^ bitbuffer[(i / sizeof(uint64_t) + 2)];
        in4 = input[(i + 24) / sizeof(z_word_t)] ^ bitbuffer[(i / sizeof(uint64_t) + 3)];
#if BYTE_ORDER == BIG_ENDIAN
        in3 = ZSWAP64(in3);
        in4 = ZSWAP64(in4);
#endif
        in3 ^= next3_64 ^ a1;
        in4 ^= next4_64 ^ a2 ^ b1;

        c1 = (in3 << 17) ^ (in3 << 55);
        c2 = (in3 >> 47) ^ (in3 >> 9) ^ (in3 << 19);
        c3 = (in3 >> 45) ^ (in3 << 44);
        c4 = (in3 >> 20);

        d1 = (in4 << 17) ^ (in4 << 55);
        d2 = (in4 >> 47) ^ (in4 >> 9) ^ (in4 << 19);
        d3 = (in4 >> 45) ^ (in4 << 44);
        d4 = (in4 >> 20);

        out1 = a3 ^ b2 ^ c1;
        out2 = a4 ^ b3 ^ c2 ^ d1;
        out3 = b4 ^ c3 ^ d2;
        out4 = c4 ^ d3;
        out5 = d4;

        next1_64 = next5_64 ^ out1;
        next2_64 = out2;
        next3_64 = out3;
        next4_64 = out4;
        next5_64 = out5;

    }

#if BYTE_ORDER == BIG_ENDIAN
    next1_64 = ZSWAP64(next1_64);
    next2_64 = ZSWAP64(next2_64);
    next3_64 = ZSWAP64(next3_64);
    next4_64 = ZSWAP64(next4_64);
    next5_64 = ZSWAP64(next5_64);
#endif

    memcpy(final, input+(i / sizeof(uint64_t)), len-i);
    final[0] ^= next1_64;
    final[1] ^= next2_64;
    final[2] ^= next3_64;
    final[3] ^= next4_64;
    final[4] ^= next5_64;

    uint8_t* final_bytes = (uint8_t*) final;

    for(size_t j = 0; j < (len-i); j++) {
        crc = crc_table[(crc ^ final_bytes[j] ^ bitbufferbytes[(j+i)]) & 0xff] ^ (crc >> 8);
    }
    return crc;
}